

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O3

void P_TranslateLineDef(line_t *ld,maplinedef_t *mld,int lineindexforid)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  FLineTrans *pFVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  ulong uVar11;
  FXlatExprState *pFVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int tag;
  char *pcVar17;
  int *piVar18;
  long lVar19;
  bool bVar20;
  FXlatExprState state;
  uint local_5c;
  FXlatExprState local_54;
  int *local_48;
  line_t *local_40;
  ulong local_38;
  
  uVar3 = mld->special;
  tag = (int)mld->tag;
  uVar8 = (uint)mld->flags;
  lVar14 = 0;
  do {
    if (((mld->flags >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar14].ismask == true)) {
      uVar8 = uVar8 & LineFlagTranslations[lVar14].newvalue;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  lVar14 = 0;
  bVar4 = false;
  local_5c = 0;
  do {
    if (((uVar8 >> ((uint)lVar14 & 0x1f) & 1) != 0) &&
       (LineFlagTranslations[lVar14].ismask == false)) {
      uVar9 = LineFlagTranslations[lVar14].newvalue;
      if (uVar9 == 0xfffffffd) {
        ld->alpha = 0.25;
      }
      else if (uVar9 == 0xffffffff) {
        bVar4 = true;
      }
      else if (uVar9 == 0xfffffffe) {
        ld->alpha = 0.75;
      }
      else {
        local_5c = local_5c | uVar9;
      }
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  if (-1 < lineindexforid) {
    FTagManager::AddLineID(&tagManager,lineindexforid,tag);
  }
  pFVar5 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array;
  if (uVar3 == 0) {
    ld->special = 0;
    ld->flags = local_5c;
    ld->args[0] = (int)mld->tag;
    ld->args[1] = 0;
    ld->args[2] = 0;
    ld->args[3] = 0;
    ld->args[4] = 0;
    return;
  }
  uVar8 = (uint)uVar3;
  if ((uVar8 < SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count) &&
     (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[uVar3].special != 0)) {
    ld->special = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[uVar3].special;
    local_5c = (pFVar5[uVar3].flags & 0x20U) << 0x12 | (pFVar5[uVar3].flags & 0x1fU) << 9 | local_5c
    ;
    uVar9 = local_5c >> 10 & 7;
    uVar10 = 1 << (sbyte)uVar9;
    ld->activation = uVar10;
    if ((uVar9 | 4) == 7) {
      ld->activation = 0x28;
      uVar10 = 0x28;
    }
    ld->flags = local_5c & 0xffffe3ff;
    if ((bVar4) && (uVar10 == 2)) {
      ld->activation = 0x40;
    }
    piVar18 = ld->args;
    lVar14 = 0;
    iVar6 = pFVar5[uVar3].args[0];
    local_54.linetype = uVar8;
    local_54.tag = tag;
    switch(pFVar5[uVar3].flags >> 0x14 & 3) {
    case 1:
      goto switchD_0046d727_caseD_1;
    case 2:
      goto switchD_0046d727_caseD_2;
    case 3:
switchD_0046d727_caseD_3:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_xlat.cpp"
                    ,0xaa,"void P_TranslateLineDef(line_t *, maplinedef_t *, int)");
    }
switchD_0046d727_caseD_0:
    *piVar18 = iVar6;
    lVar19 = lVar14;
    do {
      lVar14 = lVar19 + 2;
      if (lVar14 == 10) {
        if ((ld->flags & 0x20) == 0) {
          return;
        }
        if ((ld->activation & 0x42) == 0) {
          return;
        }
        ld->flags = ld->flags & 0xffffdfff;
        return;
      }
      piVar18 = piVar18 + 1;
      iVar6 = *(int *)((long)pFVar5[uVar3].args + lVar19 * 2 + 4);
      switch(pFVar5[uVar3].flags >> ((char)lVar19 + 0x16U & 0x1f) & 3) {
      case 0:
        goto switchD_0046d727_caseD_0;
      case 1:
switchD_0046d727_caseD_1:
        *piVar18 = tag;
        lVar19 = lVar14;
        break;
      case 2:
switchD_0046d727_caseD_2:
        local_54.bIsConstant = true;
        (*XlatExprEval[XlatExpressions.Array[iVar6]])
                  (piVar18,XlatExpressions.Array + iVar6,&local_54);
        lVar19 = lVar14;
        break;
      case 3:
        goto switchD_0046d727_caseD_3;
      }
    } while( true );
  }
  if (0 < (long)NumBoomish) {
    lVar14 = 0;
    do {
      if ((*(ushort *)((long)&Boomish[0].FirstLinetype + lVar14) <= uVar3) &&
         (uVar3 <= *(ushort *)((long)&Boomish[0].LastLinetype + lVar14))) {
        bVar1 = (&Boomish[0].NewSpecial)[lVar14];
        ld->special = (uint)bVar1;
        switch(uVar3 & 7) {
        case 1:
          local_5c = local_5c | 0x200;
        case 0:
          ld->activation = 1;
          bVar4 = false;
          goto LAB_0046d805;
        case 3:
        case 7:
          local_5c = local_5c | 0x200;
        default:
          if (bVar4) {
            ld->activation = 0x40;
          }
          else {
            ld->activation = 2;
          }
          break;
        case 5:
          local_5c = local_5c | 0x200;
        case 4:
          ld->activation = 8;
        }
        bVar4 = true;
LAB_0046d805:
        local_48 = ld->args;
        ld->args[0] = tag;
        ld->args[1] = 0;
        ld->args[2] = 0;
        ld->args[3] = 0;
        ld->args[4] = 0;
        if (*(int *)((long)&Boomish[0].Args.Count + lVar14) != 0) {
          lVar19 = *(long *)((long)&Boomish[0].Args.Array + lVar14);
          uVar15 = 0;
          local_40 = ld;
          lVar16 = lVar19;
          do {
            bVar2 = *(byte *)(lVar19 + 3 + uVar15 * 0x36);
            if ((ulong)bVar2 < 4) {
              pFVar12 = (FXlatExprState *)(local_48 + (ulong)bVar2 + 1);
            }
            else {
              local_54.linetype = local_5c >> 9 & 0x3f;
              pFVar12 = &local_54;
            }
            pcVar17 = (char *)(uVar15 * 0x36 + lVar19);
            uVar13 = (ulong)(byte)pcVar17[2];
            if (uVar13 == 0) {
              uVar8 = (uint)(byte)pcVar17[4];
            }
            else {
              local_38 = uVar13 - 1;
              bVar7 = false;
              uVar8 = 0;
              uVar11 = 0;
              do {
                while ((*(ushort *)(pcVar17 + 6) & uVar3) != *(ushort *)(lVar16 + 8 + uVar11 * 2)) {
                  uVar11 = uVar11 + 1;
                  if (uVar13 == uVar11) {
                    if (!bVar7) goto LAB_0046d90a;
                    goto LAB_0046d8d7;
                  }
                }
                uVar8 = (uint)*(byte *)(lVar16 + 0x26 + uVar11);
                bVar7 = true;
                bVar20 = uVar13 - 1 != uVar11;
                uVar11 = uVar11 + 1;
              } while (bVar20);
            }
LAB_0046d8d7:
            if (*pcVar17 == '\x01') {
              uVar8 = uVar8 | pFVar12->linetype;
            }
            pFVar12->linetype = uVar8;
            if (bVar2 == 4) {
              local_5c = local_5c & 0xffff81ff | local_54.linetype << 9;
            }
LAB_0046d90a:
            uVar15 = uVar15 + 1;
            lVar16 = lVar16 + 0x36;
            ld = local_40;
          } while (uVar15 < *(uint *)((long)&Boomish[0].Args.Count + lVar14));
        }
        if ((~uVar3 & 6) == 0) {
          if (bVar1 == 0xca) {
            *(byte *)(ld->args + 2) = (byte)ld->args[2] | 0x80;
          }
          else {
            *local_48 = 0;
          }
        }
        ld->flags = local_5c;
        if ((local_5c >> 0xd & 1) != 0 && !bVar4) {
          ld->activation = 0x80;
        }
        return;
      }
      lVar14 = lVar14 + 0x18;
    } while ((long)NumBoomish * 0x18 != lVar14);
  }
  ld->special = 0;
  ld->flags = local_5c;
  ld->args[0] = 0;
  ld->args[1] = 0;
  ld->args[2] = 0;
  ld->args[3] = 0;
  ld->args[4] = 0;
  return;
}

Assistant:

void P_TranslateLineDef (line_t *ld, maplinedef_t *mld, int lineindexforid)
{
	unsigned short special = (unsigned short) LittleShort(mld->special);
	short tag = LittleShort(mld->tag);
	DWORD flags = LittleShort(mld->flags);
	INTBOOL passthrough = 0;

	DWORD flags1 = flags;
	DWORD newflags = 0;

	for(int i=0;i<16;i++)
	{
		if ((flags & (1<<i)) && LineFlagTranslations[i].ismask)
		{
			flags1 &= LineFlagTranslations[i].newvalue;
		}
	}
	for(int i=0;i<16;i++)
	{
		if ((flags1 & (1<<i)) && !LineFlagTranslations[i].ismask)
		{
			switch (LineFlagTranslations[i].newvalue)
			{
			case -1:
				passthrough = true;
				break;
			case -2:
				ld->alpha = 0.75;
				break;
			case -3:
				ld->alpha = 0.25;
				break;
			default:
				newflags |= LineFlagTranslations[i].newvalue;
				break;
			}
		}
	}
	flags = newflags;

	if (lineindexforid >= 0)
	{
		// For purposes of maintaining BOOM compatibility, each
		// line also needs to have its ID set to the same as its tag.
		// An external conversion program would need to do this more
		// intelligently.
		tagManager.AddLineID(lineindexforid, tag);
	}

	// 0 specials are never translated.
	if (special == 0)
	{
		ld->special = 0;
		ld->flags = flags;
		ld->args[0] = mld->tag;
		memset (ld->args+1, 0, sizeof(ld->args)-sizeof(ld->args[0]));
		return;
	}

	FLineTrans *linetrans = NULL;
	if (special < SimpleLineTranslations.Size()) linetrans = &SimpleLineTranslations[special];
	if (linetrans != NULL && linetrans->special != 0)
	{
		ld->special = linetrans->special;

		ld->flags = flags | ((linetrans->flags & 0x1f) << 9);
		if (linetrans->flags & 0x20) ld->flags |= ML_FIRSTSIDEONLY;
		ld->activation = 1 << GET_SPAC(ld->flags);
		if (ld->activation == SPAC_AnyCross)
		{ // this is really PTouch
			ld->activation = SPAC_Impact|SPAC_PCross;
		}
		else if (ld->activation == SPAC_Impact)
		{ // In non-UMDF maps, Impact implies PCross
			ld->activation = SPAC_Impact | SPAC_PCross;
		}
		ld->flags &= ~ML_SPAC_MASK;

		if (passthrough && ld->activation == SPAC_Use)
		{
			ld->activation = SPAC_UseThrough;
		}
		// Set special arguments.
		FXlatExprState state;
		state.tag = tag;
		state.linetype = special;
		for (int t = 0; t < LINETRANS_MAXARGS; ++t)
		{
			int arg = linetrans->args[t];
			int argop = (linetrans->flags >> (LINETRANS_TAGSHIFT + t*TAGOP_NUMBITS)) & TAGOP_MASK;

			switch (argop)
			{
			case ARGOP_Const:
				ld->args[t] = arg;
				break;
			case ARGOP_Tag:
				ld->args[t] = tag;
				break;
			case ARGOP_Expr:
				{
					int *xnode = &XlatExpressions[arg];
					state.bIsConstant = true;
					XlatExprEval[*xnode](&ld->args[t], xnode, &state);
				}
				break;
			default:
				assert(0);
				ld->args[t] = 0;
				break;
			}
		}

		if ((ld->flags & ML_SECRET) && ld->activation & (SPAC_Use|SPAC_UseThrough))
		{
			ld->flags &= ~ML_MONSTERSCANACTIVATE;
		}
		return;
	}

	for(int i=0;i<NumBoomish;i++)
	{
		FBoomTranslator *b = &Boomish[i];

		if (special >= b->FirstLinetype && special <= b->LastLinetype)
		{
			ld->special = b->NewSpecial;

			switch (special & 0x0007)
			{
			case WalkMany:
				flags |= ML_REPEAT_SPECIAL;
			case WalkOnce:
				ld->activation = SPAC_Cross;
				break;

			case SwitchMany:
			case PushMany:
				flags |= ML_REPEAT_SPECIAL;
			case SwitchOnce:
			case PushOnce:
				if (passthrough)
					ld->activation = SPAC_UseThrough;
				else
					ld->activation = SPAC_Use;
				break;

			case GunMany:
				flags |= ML_REPEAT_SPECIAL;
			case GunOnce:
				ld->activation = SPAC_Impact;
				break;
			}

			ld->args[0] = tag;
			ld->args[1] = ld->args[2] = ld->args[3] = ld->args[4] = 0;

			for(unsigned j=0; j < b->Args.Size(); j++)
			{
				FBoomArg *arg = &b->Args[j];
				int *destp;
				int flagtemp;
				BYTE val = 0;	// quiet, GCC
				bool found;

				if (arg->ArgNum < 4)
				{
					destp = &ld->args[arg->ArgNum+1];
				}
				else
				{
					flagtemp = ((flags >> 9) & 0x3f);
					destp = &flagtemp;
				}
				if (arg->ListSize == 0)
				{
					val = arg->ConstantValue;
					found = true;
				}
				else
				{
					found = false;
					for (int k = 0; k < arg->ListSize; k++)
					{
						if ((special & arg->AndValue) == arg->ResultFilter[k])
						{
							val = arg->ResultValue[k];
							found = true;
						}
					}
				}
				if (found)
				{
					if (arg->bOrExisting)
					{
						*destp |= val;
					}
					else
					{
						*destp = val;
					}
					if (arg->ArgNum == 4)
					{
						flags = (flags & ~0x7e00) | (flagtemp << 9);
					}
				}
			}
			// We treat push triggers like switch triggers with zero tags.
			if ((special & 7) == PushMany || (special & 7) == PushOnce)
			{
				if (ld->special == Generic_Door)
				{
					ld->args[2] |= 128;
				}
				else
				{
					ld->args[0] = 0;
				}
			}
			ld->flags = flags;
			if (flags & ML_MONSTERSCANACTIVATE && ld->activation == SPAC_Cross)
			{
				// In Boom anything can activate such a line so set the proper type here.
				ld->activation = SPAC_AnyCross;
			}
			return;
		}
	}
	// Don't know what to do, so 0 it
	ld->special = 0;
	ld->flags = flags;
	memset (ld->args, 0, sizeof(ld->args));
}